

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_impl.c
# Opt level: O1

int loader_impl_dependencies(loader_impl impl)

{
  bool bVar1;
  type_id tVar2;
  value v;
  size_t sVar3;
  value *ppvVar4;
  value *ppvVar5;
  value *ppvVar6;
  size_t sVar7;
  char *pcVar8;
  dynlink pdVar9;
  char *pcVar10;
  size_t sVar11;
  bool bVar12;
  
  v = configuration_value_type(impl->config,"dependencies",10);
  if (v != (value)0x0) {
    sVar3 = value_type_count(v);
    ppvVar4 = value_to_map(v);
    if (sVar3 != 0) {
      sVar11 = 0;
      do {
        tVar2 = value_type_id(ppvVar4[sVar11]);
        if (tVar2 == 9) {
          ppvVar5 = value_to_array(ppvVar4[sVar11]);
          tVar2 = value_type_id(ppvVar5[1]);
          if (tVar2 == 9) {
            ppvVar6 = value_to_array(ppvVar5[1]);
            sVar7 = value_type_count(ppvVar5[1]);
            if (sVar7 == 0) {
LAB_00122b89:
              tVar2 = value_type_id(*ppvVar5);
              if (tVar2 == 7) {
                pcVar8 = value_to_string(*ppvVar5);
              }
              else {
                pcVar8 = "unknown_library";
              }
              pcVar10 = plugin_name(impl->p);
              log_write_impl_va("metacall",0x159,"loader_impl_dependencies",
                                "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loader/source/loader_impl.c"
                                ,LOG_LEVEL_ERROR,
                                "Failed to load dependency \'%s\' from loader configuration \'%s.json\'"
                                ,pcVar8,pcVar10);
              return 1;
            }
            bVar1 = false;
            do {
              tVar2 = value_type_id(ppvVar6[sVar11]);
              if (tVar2 == 7) {
                pcVar8 = value_to_string(ppvVar6[sVar11]);
                if (pcVar8 == (char *)0x0) {
                  bVar12 = true;
                }
                else {
                  pdVar9 = dynlink_load_absolute(pcVar8,10);
                  bVar12 = pdVar9 == (dynlink)0x0;
                  if (!bVar12) {
                    bVar1 = true;
                  }
                }
                if (!bVar12) break;
              }
              sVar7 = sVar7 - 1;
            } while (sVar7 != 0);
            if (!bVar1) goto LAB_00122b89;
          }
        }
        sVar11 = sVar11 + 1;
      } while (sVar11 != sVar3);
    }
  }
  return 0;
}

Assistant:

int loader_impl_dependencies(loader_impl impl)
{
	/* Dependencies have the following format */
	/*
	{
		"dependencies": {
			"node": ["/usr/lib/x86_64-linux-gnu/libnode.so.72"]
		}
	}
	*/
	value dependencies_value = configuration_value_type(impl->config, "dependencies", TYPE_MAP);

	if (dependencies_value != NULL)
	{
		size_t size = value_type_count(dependencies_value);
		value *dependencies_map = value_to_map(dependencies_value);
		size_t iterator;

		for (iterator = 0; iterator < size; ++iterator)
		{
			if (value_type_id(dependencies_map[iterator]) == TYPE_ARRAY)
			{
				value *library_tuple = value_to_array(dependencies_map[iterator]);

				if (value_type_id(library_tuple[1]) == TYPE_ARRAY)
				{
					value *paths_array = value_to_array(library_tuple[1]);
					size_t paths_size = value_type_count(library_tuple[1]);
					size_t path;
					int found = 0;

					for (path = 0; path < paths_size; ++path)
					{
						if (value_type_id(paths_array[iterator]) == TYPE_STRING)
						{
							const char *library_path = value_to_string(paths_array[iterator]);

							if (library_path != NULL)
							{
								dynlink handle = dynlink_load_absolute(library_path, DYNLINK_FLAGS_BIND_LAZY | DYNLINK_FLAGS_BIND_GLOBAL);

								if (handle != NULL)
								{
									found = 1;
									break;
								}
							}
						}
					}

					if (!found)
					{
						const char *dependency = value_type_id(library_tuple[0]) == TYPE_STRING ? value_to_string(library_tuple[0]) : "unknown_library";
						log_write("metacall", LOG_LEVEL_ERROR, "Failed to load dependency '%s' from loader configuration '%s.json'", dependency, plugin_name(impl->p));
						return 1;
					}
				}
			}
		}
	}

	return 0;
}